

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vOrder,int *pCounter)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pObj_01;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    iVar1 = pObj->Id;
    lVar4 = (long)iVar1;
    if ((lVar4 < 0) || (vOrder->nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar3 = vOrder->pArray;
    if (-1 < piVar3[lVar4]) {
      __assert_fail("Llb_ObjBddVar(vOrder, pObj) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Nonlin.c"
                    ,0x115,
                    "void Llb_Nonlin4CreateOrder_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, int *)")
      ;
    }
    if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
      iVar2 = *pCounter;
      *pCounter = iVar2 + 1;
      if (vOrder->nSize <= iVar1) {
LAB_007e5fcc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar3[lVar4] = iVar2;
    }
    else {
      pObj_00 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      pAVar5 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      pObj_01 = pAVar5;
      if ((*(uint *)&pObj_00->field_0x1c & 0xffffff) <= (*(uint *)&pAVar5->field_0x1c & 0xffffff)) {
        pObj_01 = pObj_00;
        pObj_00 = pAVar5;
      }
      Llb_Nonlin4CreateOrder_rec(pAig,pObj_00,vOrder,pCounter);
      Llb_Nonlin4CreateOrder_rec(pAig,pObj_01,vOrder,pCounter);
      if ((pObj->field_0x18 & 0x10) != 0) {
        iVar1 = pObj->Id;
        iVar2 = *pCounter;
        *pCounter = iVar2 + 1;
        if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) goto LAB_007e5fcc;
        vOrder->pArray[iVar1] = iVar2;
      }
    }
  }
  return;
}

Assistant:

void Llb_Nonlin4CreateOrder_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vOrder, int * pCounter )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( pAig, pObj );
    assert( Llb_ObjBddVar(vOrder, pObj) < 0 );
    if ( Aig_ObjIsCi(pObj) )
    {
//        if ( Saig_ObjIsLo(pAig, pObj) )
//            Vec_IntWriteEntry( vOrder, Aig_ObjId(Saig_ObjLoToLi(pAig, pObj)), (*pCounter)++ );
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
        return;
    }
    // try fanins with higher level first
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
//    if ( pFanin0->Level > pFanin1->Level || (pFanin0->Level == pFanin1->Level && pFanin0->Id < pFanin1->Id) )
    if ( pFanin0->Level > pFanin1->Level )
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
    }
    else
    {
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin1, vOrder, pCounter );
        Llb_Nonlin4CreateOrder_rec( pAig, pFanin0, vOrder, pCounter );
    }
    if ( pObj->fMarkA )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), (*pCounter)++ );
}